

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O0

int XLearnGetStr(XL *out,char *key,string *value)

{
  XLearn *this;
  int iVar1;
  HyperParam *pHVar2;
  string *in_RDX;
  char *in_RSI;
  undefined8 *in_RDI;
  runtime_error *_except_;
  XLearn *xl;
  
  this = (XLearn *)*in_RDI;
  iVar1 = strcmp(in_RSI,"task");
  if (iVar1 == 0) {
    pHVar2 = XLearn::GetHyperParam(this);
    std::__cxx11::string::operator=(in_RDX,(string *)&pHVar2->loss_func);
  }
  else {
    iVar1 = strcmp(in_RSI,"metric");
    if (iVar1 == 0) {
      pHVar2 = XLearn::GetHyperParam(this);
      std::__cxx11::string::operator=(in_RDX,(string *)&pHVar2->metric);
    }
    else {
      iVar1 = strcmp(in_RSI,"log");
      if (iVar1 == 0) {
        pHVar2 = XLearn::GetHyperParam(this);
        std::__cxx11::string::operator=(in_RDX,(string *)&pHVar2->log_file);
      }
      else {
        iVar1 = strcmp(in_RSI,"loss");
        if (iVar1 == 0) {
          pHVar2 = XLearn::GetHyperParam(this);
          std::__cxx11::string::operator=(in_RDX,(string *)&pHVar2->loss_func);
        }
        else {
          iVar1 = strcmp(in_RSI,"opt");
          if (iVar1 == 0) {
            pHVar2 = XLearn::GetHyperParam(this);
            std::__cxx11::string::operator=(in_RDX,(string *)&pHVar2->opt_type);
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

XL_DLL int XLearnGetStr(XL *out, const char *key, std::string& value) {
  API_BEGIN();
  XLearn* xl = reinterpret_cast<XLearn*>(*out);
  if (strcmp(key, "task") == 0) {
    value = xl->GetHyperParam().loss_func;
  } else if (strcmp(key, "metric") == 0) {
    value = xl->GetHyperParam().metric;
  } else if (strcmp(key, "log") == 0) {
    value = xl->GetHyperParam().log_file;
  } else if (strcmp(key, "loss") == 0) {
    value = xl->GetHyperParam().loss_func;
  } else if (strcmp(key, "opt") == 0) {
    value = xl->GetHyperParam().opt_type;
  }
  API_END();
}